

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viewer.cpp
# Opt level: O0

void CMU462::Viewer::drawInfo(void)

{
  Color color;
  string renderer_info_1;
  string renderer_info;
  string framerate_info;
  Color c;
  double elapsed;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe68;
  allocator *paVar1;
  OSDText *in_stack_fffffffffffffe70;
  string *text;
  undefined4 in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe7c;
  int line_id;
  undefined4 in_stack_fffffffffffffe80;
  float in_stack_fffffffffffffe84;
  undefined4 uVar2;
  string local_160 [12];
  int in_stack_fffffffffffffeac;
  allocator local_139;
  string local_138 [8];
  OSDText *in_stack_fffffffffffffed0;
  string local_118 [32];
  string local_f8;
  string local_d8 [48];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  Color local_48;
  Color local_30;
  rep local_20;
  duration<double,_std::ratio<1L,_1L>_> local_18;
  rep_conflict local_10;
  undefined8 local_8;
  
  sys_curr = std::chrono::_V2::system_clock::now();
  local_8 = sys_curr;
  local_20 = (rep)std::chrono::operator-
                            ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                              *)in_stack_fffffffffffffe68,
                             (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                              *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            ((duration<double,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffffe70,
             (duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffffe68);
  local_10 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_18);
  if (local_10 < 1.0) {
    framecount = framecount + 1;
  }
  else {
    if (framecount < 0x14) {
      Color::Color(&local_30,1.0,0.35,0.35,1.0);
    }
    else {
      Color::Color(&local_30,0.15,0.5,0.15,1.0);
    }
    local_48.r = local_30.r;
    local_48.g = local_30.g;
    local_48.b = local_30.b;
    local_48.a = local_30.a;
    color.g = (float)in_stack_fffffffffffffe7c;
    color.r = (float)in_stack_fffffffffffffe78;
    color.b = (float)in_stack_fffffffffffffe80;
    color.a = in_stack_fffffffffffffe84;
    OSDText::set_color(in_stack_fffffffffffffe70,(int)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                       color);
    std::__cxx11::to_string(in_stack_fffffffffffffeac);
    std::operator+((char *)in_stack_fffffffffffffe68,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
    std::operator+(in_stack_fffffffffffffe68,
                   (char *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
    std::__cxx11::string::~string(local_88);
    std::__cxx11::string::~string(local_a8);
    std::__cxx11::string::string(local_d8,local_68);
    OSDText::set_text((OSDText *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                      in_stack_fffffffffffffe7c,(string *)in_stack_fffffffffffffe70);
    std::__cxx11::string::~string(local_d8);
    framecount = 0;
    sys_last = sys_curr;
    std::__cxx11::string::~string(local_68);
  }
  if (renderer == (long *)0x0) {
    paVar1 = &local_139;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_138,"No input renderer",paVar1);
    std::allocator<char>::~allocator((allocator<char> *)&local_139);
    std::__cxx11::string::string(local_160,local_138);
    OSDText::set_text((OSDText *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                      in_stack_fffffffffffffe7c,(string *)in_stack_fffffffffffffe70);
    std::__cxx11::string::~string(local_160);
    std::__cxx11::string::~string(local_138);
  }
  else {
    text = &local_f8;
    (**(code **)(*renderer + 0x30))();
    line_id = (int)((ulong)osd_text >> 0x20);
    uVar2 = line_id_renderer;
    std::__cxx11::string::string(local_118,(string *)text);
    OSDText::set_text((OSDText *)CONCAT44(uVar2,in_stack_fffffffffffffe80),line_id,text);
    std::__cxx11::string::~string(local_118);
    std::__cxx11::string::~string((string *)&local_f8);
  }
  OSDText::render(in_stack_fffffffffffffed0);
  return;
}

Assistant:

void Viewer::drawInfo() {

  // compute timers - fps is update every second
  sys_curr = system_clock::now();
  double elapsed = ((duration<double>) (sys_curr - sys_last)).count();
  if (elapsed >= 1.0f) {

    // update framecount OSD
    Color c = framecount < 20 ? Color(1.0, 0.35, 0.35) : Color(0.15, 0.5, 0.15);
    osd_text->set_color(line_id_framerate, c);
    string framerate_info = "Framerate: " + to_string(framecount) + " fps";
    osd_text->set_text(line_id_framerate, framerate_info);

    // reset timer and counter
    framecount = 0;
    sys_last = sys_curr; 

  } else {

    // increment framecount
    framecount++;
  
  }

  // udpate renderer OSD
  // TODO: This is done on every update and it shouldn't be!
  // The viewer should only update when the renderer needs to
  // update the info text. 
  if (renderer) {
    string renderer_info = renderer->info();
    osd_text->set_text(line_id_renderer, renderer_info);
  } else {
    string renderer_info = "No input renderer";
    osd_text->set_text(line_id_renderer, renderer_info);
  }

  // render OSD
  osd_text->render();

}